

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CoverCrossBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  CoverCrossBodySymbol *this_00;
  
  this_00 = (CoverCrossBodySymbol *)allocate(this,0x80,8);
  ast::CoverCrossBodySymbol::CoverCrossBodySymbol(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }